

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreaterThanOrEqual.h
# Opt level: O1

ptr<Value> __thiscall
GreaterThanOrEqual::asStrings(GreaterThanOrEqual *this,string *leftOperand,string *rightOperand)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int **pp_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar3;
  
  iVar1 = std::__cxx11::string::compare((string *)rightOperand);
  pp_Var2 = (_func_int **)operator_new(0x20);
  pp_Var2[1] = (_func_int *)0x100000001;
  *pp_Var2 = (_func_int *)&PTR___Sp_counted_ptr_inplace_0012f608;
  pp_Var2[2] = (_func_int *)&PTR__Member_0012f658;
  *(bool *)(pp_Var2 + 3) = -1 < iVar1;
  (this->super_Operation)._vptr_Operation = pp_Var2 + 2;
  this[1].super_Operation._vptr_Operation = pp_Var2;
  pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> asStrings(const std::string &leftOperand, const std::string &rightOperand) override {
        return make<Boolean>(leftOperand >= rightOperand);
    }